

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

void __thiscall TypeOpNotEqual::TypeOpNotEqual(TypeOpNotEqual *this,TypeFactory *t)

{
  OpBehavior *this_00;
  allocator local_39;
  string local_38 [32];
  TypeFactory *local_18;
  TypeFactory *t_local;
  TypeOpNotEqual *this_local;
  
  local_18 = t;
  t_local = (TypeFactory *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"!=",&local_39);
  TypeOpBinary::TypeOpBinary
            (&this->super_TypeOpBinary,t,CPUI_INT_NOTEQUAL,(string *)local_38,TYPE_BOOL,TYPE_INT);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  (this->super_TypeOpBinary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_0084b108;
  (this->super_TypeOpBinary).super_TypeOp.opflags = 0x14080;
  (this->super_TypeOpBinary).super_TypeOp.addlflags = 1;
  this_00 = (OpBehavior *)operator_new(0x10);
  OpBehaviorNotEqual::OpBehaviorNotEqual((OpBehaviorNotEqual *)this_00);
  (this->super_TypeOpBinary).super_TypeOp.behave = this_00;
  return;
}

Assistant:

TypeOpNotEqual::TypeOpNotEqual(TypeFactory *t)
  : TypeOpBinary(t,CPUI_INT_NOTEQUAL,"!=",TYPE_BOOL,TYPE_INT)
{
  opflags = PcodeOp::binary | PcodeOp::booloutput | PcodeOp::commutative;
  addlflags = inherits_sign;
  behave = new OpBehaviorNotEqual();
}